

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

gc_heap_ptr<mjs::regexp_object>
mjs::regexp_object::make
          (gc_heap_ptr<mjs::global_object> *global,wstring_view *pattern,regexp_flag flags)

{
  int iVar1;
  ulong uVar2;
  gc_heap *h;
  void *pvVar3;
  long *plVar4;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  gc_heap_ptr<mjs::regexp_object> gVar8;
  wstring res;
  string_view local_a0;
  wchar_t local_90;
  undefined4 uStack_8c;
  gc_heap_ptr_untyped local_80;
  wstring_view *local_70;
  gc_heap *local_68;
  gc_heap *local_60;
  size_t local_58;
  gc_heap_ptr_untyped local_50;
  wstring_view local_40;
  
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  local_58 = *(size_t *)((long)pvVar3 + 8);
  plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  (**(code **)(*plVar4 + 0x78))(&local_50,plVar4);
  uVar7 = *(ulong *)CONCAT44(in_register_00000014,flags);
  uVar2 = ((ulong *)CONCAT44(in_register_00000014,flags))[1];
  pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  h = *(gc_heap **)((long)pvVar3 + 8);
  if (uVar7 == 0) {
    local_a0._M_len = 4;
    local_a0._M_str = "(?:)";
    string::string((string *)&local_80,h,&local_a0);
  }
  else {
    local_a0._M_len = (size_t)&local_90;
    local_a0._M_str = (char *)0x0;
    local_90 = L'\0';
    uVar7 = uVar7 & 0xffffffff;
    local_70 = pattern;
    local_68 = (gc_heap *)global;
    local_60 = h;
    if (uVar7 != 0) {
      uVar5 = 0;
      bVar6 = false;
      do {
        iVar1 = *(int *)(uVar2 + uVar5 * 4);
        if (bVar6) {
          bVar6 = false;
        }
        else if (iVar1 == 0x5c) {
          bVar6 = true;
        }
        else if (iVar1 == 0x2f) {
          std::__cxx11::wstring::push_back((wchar_t)&local_a0);
        }
        std::__cxx11::wstring::push_back((wchar_t)&local_a0);
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    local_40._M_len = (size_t)local_a0._M_str;
    local_40._M_str = (wchar_t *)local_a0._M_len;
    string::string((string *)&local_80,local_60,&local_40);
    global = (gc_heap_ptr<mjs::global_object> *)local_68;
    pattern = local_70;
    if ((wchar_t *)local_a0._M_len != &local_90) {
      operator_delete((void *)local_a0._M_len,CONCAT44(uStack_8c,local_90) * 4 + 4);
    }
  }
  gc_heap::
  allocate_and_construct<mjs::regexp_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::gc_heap_ptr<mjs::object>,mjs::string,mjs::regexp_flag&>
            ((gc_heap *)global,local_58,(gc_heap_ptr<mjs::global_object> *)0x40,
             (gc_heap_ptr<mjs::object> *)pattern,(string *)&local_50,(regexp_flag *)&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  gVar8.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar8.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)global;
  return (gc_heap_ptr<mjs::regexp_object>)gVar8.super_gc_heap_ptr_untyped;
}

Assistant:

static gc_heap_ptr<regexp_object> make(const gc_heap_ptr<global_object>& global, const std::wstring_view& pattern, regexp_flag flags) {
        return global->heap().make<regexp_object>(global, global->regexp_prototype(), get_source_string(global, pattern), flags);
    }